

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::cpp_function::cpp_function<std::__cxx11::string,Person>
          (cpp_function *this,offset_in_Job_to_subr f)

{
  offset_in_Job_to_subr in_RDX;
  type local_40;
  offset_in_Job_to_subr local_30;
  offset_in_Job_to_subr f_local;
  cpp_function *local_20;
  cpp_function *this_local;
  
  local_30 = f;
  f_local = in_RDX;
  local_20 = this;
  this_local = (cpp_function *)f;
  function::function(&this->super_function);
  local_40._8_8_ = f_local;
  local_40.f = local_30;
  initialize<pybind11::cpp_function::initialize<std::__cxx11::string,Person>(std::__cxx11::string(Person::*)()const)::_lambda(Person_const*)_1_,std::__cxx11::string,Person_const*>
            (this,&local_40,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Person_ptr *)
             0x0);
  return;
}

Assistant:

cpp_function(Return (Class::*f)(Arg...) const PYBIND11_NOEXCEPT_SPECIFIER, const Extra&... extra) {
        initialize([f](const Class *c, Arg... args) -> Return { return (c->*f)(args...); },
                   (Return (*)(const Class *, Arg ...) PYBIND11_NOEXCEPT_SPECIFIER) nullptr, extra...);
    }